

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O0

void gimage::extractLines
               (vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *pl,ImageU8 *image,int c,
               int min_size,bool closed,float tolerance)

{
  byte bVar1;
  store_t sVar2;
  bool bVar3;
  int iVar4;
  Polygon *p_00;
  ImageU8 *mask_00;
  long sx;
  int in_ECX;
  uint in_EDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  byte in_R8B;
  float in_XMM0_Da;
  float in_stack_0000000c;
  Polygon *in_stack_00000010;
  Polygon p;
  long x;
  long y;
  ImageU8 mask;
  int in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff38;
  ushort in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffff40;
  float tolerance_00;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffff50;
  ImageU8 *image_00;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_78;
  ImageU8 *local_70;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_58;
  float local_20;
  byte local_19;
  int local_18;
  uint local_14;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_19 = in_R8B & 1;
  local_20 = in_XMM0_Da;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  p_00 = (Polygon *)Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RSI);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            (in_stack_ffffffffffffff40,
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,
                               CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))),
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),in_stack_ffffffffffffff2c
            );
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear(in_stack_ffffffffffffff50);
  local_70 = (ImageU8 *)0x0;
  while (image_00 = local_70,
        mask_00 = (ImageU8 *)
                  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10),
        (long)image_00 < (long)mask_00) {
    local_78 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)0x0;
    while (in_stack_ffffffffffffff40 = local_78,
          sx = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10),
          (long)in_stack_ffffffffffffff40 < sx) {
      Polygon::Polygon((Polygon *)0x188d02);
      bVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                        (local_10,(long)local_78,(long)local_70,0);
      if ((bVar1 == local_14) &&
         (sVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                            (&local_58,(long)local_78,(long)local_70,0), sVar2 == '\0')) {
        extractContour(p_00,mask_00,image_00,sx,(long)in_stack_ffffffffffffff40,
                       CONCAT13(bVar1,(uint3)in_stack_ffffffffffffff3c));
        tolerance_00 = (float)((ulong)sx >> 0x20);
        iVar4 = Polygon::count((Polygon *)0x188d97);
        if ((local_18 <= iVar4) &&
           (((local_19 & 1) == 0 ||
            (bVar3 = Polygon::isClosed((Polygon *)image_00,tolerance_00), bVar3)))) {
          if (0.0 <= local_20) {
            Polygon::reduce(in_stack_00000010,in_stack_0000000c);
          }
          std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::push_back
                    ((vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *)
                     in_stack_ffffffffffffff40,
                     (value_type *)
                     CONCAT17(bVar1,CONCAT16(sVar2,CONCAT24(in_stack_ffffffffffffff3c,iVar4))));
        }
      }
      Polygon::~Polygon((Polygon *)0x188e50);
      local_78 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 ((long)&local_78->depth + 1);
    }
    local_70 = (ImageU8 *)((long)&local_70->depth + 1);
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(in_stack_ffffffffffffff40);
  return;
}

Assistant:

void extractLines(std::vector<Polygon> &pl, const ImageU8 &image, int c, int min_size, bool closed,
  float tolerance)
{
  ImageU8 mask(image.getWidth(), image.getHeight(), 1);
  mask.clear();

  for (long y=0; y<image.getHeight(); y++)
  {
    for (long x=0; x<image.getWidth(); x++)
    {
      Polygon p;

      if (image.get(x, y) == c && mask.get(x, y) == 0)
      {
        extractContour(p, mask, image, x, y, 0);

        if (p.count() >= min_size)
        {
          if (!closed || p.isClosed())
          {
            if (tolerance >= 0)
            {
              p.reduce(tolerance);
            }

            pl.push_back(p);
          }
        }
      }
    }
  }
}